

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O3

int sort_source(void *a,void *b)

{
  int iVar1;
  char *__nptr;
  char *__nptr_00;
  ulong uVar2;
  ulong uVar3;
  
  __nptr = (char *)bc_trie_lookup((bc_trie_t *)a,"c");
  __nptr_00 = (char *)bc_trie_lookup((bc_trie_t *)b,"c");
  iVar1 = 0;
  if (__nptr_00 != (char *)0x0 && __nptr != (char *)0x0) {
    uVar2 = strtoul(__nptr,(char **)0x0,10);
    uVar3 = strtoul(__nptr_00,(char **)0x0,10);
    iVar1 = (int)uVar3 - (int)uVar2;
  }
  return iVar1;
}

Assistant:

static int
sort_source(const void *a, const void *b)
{
    const char *ca = bc_trie_lookup((bc_trie_t*) a, "c");
    const char *cb = bc_trie_lookup((bc_trie_t*) b, "c");

    if (ca == NULL || cb == NULL) {
        return 0;  // wat
    }

    unsigned long la = strtoul(ca, NULL, 10);
    unsigned long lb = strtoul(cb, NULL, 10);

    return (int) (lb - la);
}